

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STInteger.h
# Opt level: O2

void __thiscall jbcoin::STInteger<unsigned_long>::add(STInteger<unsigned_long> *this,Serializer *s)

{
  SerializedTypeID SVar1;
  SField *pSVar2;
  uint __line;
  SerializedTypeID SVar3;
  char *__assertion;
  
  pSVar2 = (this->super_STBase).fName;
  if (pSVar2->fieldValue < 0x100) {
    SVar1 = pSVar2->fieldType;
    SVar3 = (*(this->super_STBase)._vptr_STBase[4])();
    if (SVar1 == SVar3) {
      Serializer::add64(s,this->value_);
      return;
    }
    __assertion = "fName->fieldType == getSType ()";
    __line = 0x46;
  }
  else {
    __assertion = "fName->isBinary ()";
    __line = 0x45;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STInteger.h"
                ,__line,"virtual void jbcoin::STInteger<unsigned long>::add(Serializer &) const");
}

Assistant:

void
    add (Serializer& s) const override
    {
        assert (fName->isBinary ());
        assert (fName->fieldType == getSType ());
        s.addInteger (value_);
    }